

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::assert_invariant(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *this)

{
  bool bVar1;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_local;
  
  bVar1 = true;
  if (this->m_type == object) {
    bVar1 = (this->m_value).object != (object_t *)0x0;
  }
  if (!bVar1) {
    __assert_fail("m_type != value_t::object or m_value.object != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/nlohmann/json.hpp"
                  ,0x35f2,
                  "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  bVar1 = true;
  if (this->m_type == array) {
    bVar1 = (this->m_value).object != (object_t *)0x0;
  }
  if (!bVar1) {
    __assert_fail("m_type != value_t::array or m_value.array != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/nlohmann/json.hpp"
                  ,0x35f3,
                  "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  bVar1 = true;
  if (this->m_type == string) {
    bVar1 = (this->m_value).object != (object_t *)0x0;
  }
  if (!bVar1) {
    __assert_fail("m_type != value_t::string or m_value.string != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/nlohmann/json.hpp"
                  ,0x35f4,
                  "void nlohmann::basic_json<>::assert_invariant() const [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                 );
  }
  return;
}

Assistant:

void assert_invariant() const noexcept
    {
        assert(m_type != value_t::object or m_value.object != nullptr);
        assert(m_type != value_t::array or m_value.array != nullptr);
        assert(m_type != value_t::string or m_value.string != nullptr);
    }